

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFallbackValue,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  BinaryAggregateHeap<duckdb::string_t,_long,_duckdb::LessThan> *this;
  ulong uVar1;
  long lVar2;
  STORAGE_TYPE *pSVar3;
  HeapEntry<long> *pHVar4;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  idx_t i_1;
  ulong uVar10;
  UnifiedVectorFormat state_format;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar1 = duckdb::ListVector::GetListSize(result);
  lVar8 = 0;
  for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
    iVar6 = iVar5;
    if (*local_78 != 0) {
      iVar6 = (idx_t)*(uint *)(*local_78 + iVar5 * 4);
    }
    lVar8 = lVar8 + *(long *)(*(long *)(local_70 + iVar6 * 8) + 0x10);
  }
  duckdb::ListVector::Reserve(result,lVar8 + uVar1);
  lVar8 = *(long *)(result + 0x20);
  lVar2 = duckdb::ListVector::GetEntry(result);
  for (uVar10 = 0; uVar10 != count; uVar10 = uVar10 + 1) {
    uVar7 = uVar10;
    if (*local_78 != 0) {
      uVar7 = (ulong)*(uint *)(*local_78 + uVar10 * 4);
    }
    this = *(BinaryAggregateHeap<duckdb::string_t,_long,_duckdb::LessThan> **)(local_70 + uVar7 * 8)
    ;
    if (((char)this[1].capacity == '\x01') && (iVar5 = this->size, iVar5 != 0)) {
      lVar9 = (uVar10 + offset) * 0x10;
      *(ulong *)(lVar8 + lVar9) = uVar1;
      *(idx_t *)(lVar8 + 8 + lVar9) = iVar5;
      pSVar3 = BinaryAggregateHeap<duckdb::string_t,_long,_duckdb::LessThan>::SortAndGetHeap(this);
      lVar9 = *(long *)(lVar2 + 0x20);
      pHVar4 = &pSVar3->second;
      for (uVar7 = 0; uVar7 < this->size; uVar7 = uVar7 + 1) {
        *(long *)(uVar1 * 8 + lVar9 + uVar7 * 8) = pHVar4->value;
        pHVar4 = pHVar4 + 5;
      }
      uVar1 = uVar1 + uVar7;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),uVar10 + offset);
    }
  }
  duckdb::ListVector::SetListSize(result,uVar1);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}